

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ImGui::CalcTypematicRepeatAmount(float t0,float t1,float repeat_delay,float repeat_rate)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 1;
  if (((t1 != 0.0) || (NAN(t1))) && (iVar2 = 0, t0 < t1)) {
    if (0.0 < repeat_rate) {
      iVar2 = (int)((t0 - repeat_delay) / repeat_rate);
      if (t0 < repeat_delay) {
        iVar2 = -1;
      }
      iVar1 = (int)((t1 - repeat_delay) / repeat_rate);
      if (t1 < repeat_delay) {
        iVar1 = -1;
      }
      return iVar1 - iVar2;
    }
    return -(uint)(repeat_delay <= t1 && t0 < repeat_delay) & 1;
  }
  return iVar2;
}

Assistant:

int ImGui::CalcTypematicRepeatAmount(float t0, float t1, float repeat_delay, float repeat_rate)
{
    if (t1 == 0.0f)
        return 1;
    if (t0 >= t1)
        return 0;
    if (repeat_rate <= 0.0f)
        return (t0 < repeat_delay) && (t1 >= repeat_delay);
    const int count_t0 = (t0 < repeat_delay) ? -1 : (int)((t0 - repeat_delay) / repeat_rate);
    const int count_t1 = (t1 < repeat_delay) ? -1 : (int)((t1 - repeat_delay) / repeat_rate);
    const int count = count_t1 - count_t0;
    return count;
}